

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

deUint32 __thiscall
vkt::synchronization::anon_unknown_0::ClearAttachments::Support::getResourceUsageFlags
          (Support *this)

{
  VkImageAspectFlags VVar1;
  Support *this_local;
  
  VVar1 = (this->m_resourceDesc).imageAspect;
  if (VVar1 == 1) {
    this_local._4_4_ = 0x10;
  }
  else if ((VVar1 == 2) || (VVar1 == 4)) {
    this_local._4_4_ = 0x20;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

deUint32 getResourceUsageFlags (void) const
	{
		switch (m_resourceDesc.imageAspect)
		{
			case VK_IMAGE_ASPECT_COLOR_BIT:
				return VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT;
			case VK_IMAGE_ASPECT_STENCIL_BIT:
			case VK_IMAGE_ASPECT_DEPTH_BIT:
				return VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT;
			default:
				DE_ASSERT(0);
		}
		return 0u;
	}